

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.h
# Opt level: O0

process_status __thiscall
state_machine::state_machine::
StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s3<3>,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::transition::detail::guard_always,state_machine::transition::detail::action_pass,state_machine::transition::State<void>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s3_e3,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_greater_than<0>,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_less_than<1>,(anonymous_namespace)::return_s3<0>,state_machine::transition::State<(anonymous_namespace)::s3>>>>>
::
find_transition<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_greater_than<0>,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_less_than<1>,(anonymous_namespace)::return_s3<0>,state_machine::transition::State<(anonymous_namespace)::s3>>>,(anonymous_namespace)::e3,0ul,1ul>
          (StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s3<3>,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::transition::detail::guard_always,state_machine::transition::detail::action_pass,state_machine::transition::State<void>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s3_e3,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_greater_than<0>,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_less_than<1>,(anonymous_namespace)::return_s3<0>,state_machine::transition::State<(anonymous_namespace)::s3>>>>>
           *this,Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_greater_than<0>,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_less_than<1>,_(anonymous_namespace)::return_s3<0>,_state_machine::transition::State<(anonymous_namespace)::s3>_>_>
                 *row,event_type *event)

{
  bool bVar1;
  data_type *__t;
  __tuple_element_t<0UL,_tuple<Transition<State<s3>,_Event<e3>,_e3_greater_than<0>,_return_s2,_State<s2>_>,_Transition<State<s3>,_Event<e3>,_e3_less_than<1>,_return_s3<0>,_State<s3>_>_>_>
  *this_00;
  s3 *psVar2;
  process_status local_49;
  s3 *state;
  __tuple_element_t<0UL,_tuple<Transition<State<s3>,_Event<e3>,_e3_greater_than<0>,_return_s2,_State<s2>_>,_Transition<State<s3>,_Event<e3>,_e3_less_than<1>,_return_s3<0>,_State<s3>_>_>_>
  *transition;
  e3 *event_local;
  Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_greater_than<0>,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_less_than<1>,_(anonymous_namespace)::return_s3<0>,_state_machine::transition::State<(anonymous_namespace)::s3>_>_>
  *row_local;
  StateMachine<_b61f1d36_> *this_local;
  
  __t = state_machine::transition::
        Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_greater_than<0>,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_less_than<1>,_(anonymous_namespace)::return_s3<0>,_state_machine::transition::State<(anonymous_namespace)::s3>_>_>
        ::data(row);
  this_00 = std::
            get<0ul,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_greater_than<0>,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_less_than<1>,(anonymous_namespace)::return_s3<0>,state_machine::transition::State<(anonymous_namespace)::s3>>>
                      (__t);
  psVar2 = variant::
           Variant<(anonymous_namespace)::s1,_(anonymous_namespace)::s3,_(anonymous_namespace)::s2>
           ::get<(anonymous_namespace)::s3,_0>
                     ((Variant<(anonymous_namespace)::s1,_(anonymous_namespace)::s3,_(anonymous_namespace)::s2>
                       *)(this + 8));
  bVar1 = state_machine::transition::
          Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_greater_than<0>,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>
          ::invoke_guard<bool,_0>(this_00,psVar2,event);
  if (bVar1) {
    local_49 = StateMachine<$b61f1d36$>::
               do_transition<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_greater_than<0>,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>,_(anonymous_namespace)::e3,_0>
                         ((StateMachine<_b61f1d36_> *)this,this_00,event);
  }
  else {
    local_49 = StateMachine<$b61f1d36$>::
               find_transition<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_greater_than<0>,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(anonymous_namespace)::e3_less_than<1>,_(anonymous_namespace)::return_s3<0>,_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_(anonymous_namespace)::e3,_1UL>
                         ((StateMachine<_b61f1d36_> *)this,row,event);
  }
  return local_49;
}

Assistant:

auto find_transition(const Row& row, Event&& event, std::index_sequence<I, Is...>)
        -> process_status {
        const auto& transition = std::get<I>(row.data());
        const auto& state = state_.template get<typename Row::source_type>();

        return transition.invoke_guard(state, event) ?
                   do_transition(transition, std::forward<Event>(event)) :
                   find_transition(row, std::forward<Event>(event), std::index_sequence<Is...>{});
    }